

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

TaprootScriptTree *
cfd::core::TaprootScriptTree::FromString
          (TaprootScriptTree *__return_storage_ptr__,string *text,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  pointer pBVar1;
  bool bVar2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  TaprootScriptTree target_leaf;
  TapBranch branch;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_158;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  TaprootScriptTree local_128;
  TapBranch local_98;
  
  TapBranch::FromString(&local_98,text);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&local_158,target_nodes);
  if (local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_158.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    TaprootScriptTree(&local_128,tapscript);
    pBVar1 = local_158.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    TapBranch::GetBaseHash((ByteData256 *)&local_140,&local_128.super_TapBranch);
    bVar2 = ByteData256::Equals(pBVar1 + -1,(ByteData256 *)&local_140);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
    if (bVar2) {
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::erase
                (&local_158,
                 local_158.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    ~TaprootScriptTree(&local_128);
  }
  TapBranch::ChangeTapLeaf(&local_128.super_TapBranch,&local_98,tapscript,&local_158);
  TapBranch::operator=(&local_98,&local_128.super_TapBranch);
  TapBranch::~TapBranch(&local_128.super_TapBranch);
  TaprootScriptTree(__return_storage_ptr__,&local_98);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_158);
  TapBranch::~TapBranch(&local_98);
  return __return_storage_ptr__;
}

Assistant:

TaprootScriptTree TaprootScriptTree::FromString(
    const std::string& text, const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) {
  auto branch = TapBranch::FromString(text);
  auto check_nodes = target_nodes;
  if (!check_nodes.empty()) {
    TaprootScriptTree target_leaf(tapscript);
    if (check_nodes.back().Equals(target_leaf.GetTapLeafHash())) {
      check_nodes.erase(check_nodes.end() - 1);
    }
  }
  branch = branch.ChangeTapLeaf(tapscript, check_nodes);
  return TaprootScriptTree(branch);
}